

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_text_to_content_json.cpp
# Opt level: O1

string * sha256(string *__return_storage_ptr__,string *data)

{
  pointer pcVar1;
  undefined8 uStack_48;
  uint8_t digest [32];
  size_type __dnew;
  
  SHA256((uchar *)(data->_M_dataplus)._M_p,data->_M_string_length,(uchar *)&uStack_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  digest[0x18] = ' ';
  digest[0x19] = '\0';
  digest[0x1a] = '\0';
  digest[0x1b] = '\0';
  digest[0x1c] = '\0';
  digest[0x1d] = '\0';
  digest[0x1e] = '\0';
  digest[0x1f] = '\0';
  pcVar1 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)(digest + 0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = digest._24_8_;
  *(undefined8 *)(pcVar1 + 0x10) = digest._8_8_;
  *(undefined8 *)(pcVar1 + 0x18) = digest._16_8_;
  *(undefined8 *)pcVar1 = uStack_48;
  *(undefined8 *)(pcVar1 + 8) = digest._0_8_;
  __return_storage_ptr__->_M_string_length = digest._24_8_;
  (__return_storage_ptr__->_M_dataplus)._M_p[digest._24_8_] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(const std::string &data) {
  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(reinterpret_cast<const uint8_t *>(data.data()), data.size(), digest);
  return std::string{reinterpret_cast<const char *>(digest),
                     SHA256_DIGEST_LENGTH};
}